

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O3

int ulong_to_str(unsigned_long num,char *str,int strlen)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  unsigned_long uVar4;
  long lVar5;
  long lVar6;
  
  if (num != 0) {
    uVar4 = num;
    lVar6 = 0;
    do {
      lVar5 = lVar6;
      lVar6 = lVar5 + 1;
      bVar1 = 9 < uVar4;
      uVar4 = uVar4 / 10;
    } while (bVar1);
    lVar5 = lVar5 + 2;
    iVar2 = -1;
    if ((int)lVar5 < strlen) {
      str[lVar6] = '\0';
      lVar3 = lVar6;
      do {
        str[lVar5 + -2] = (char)num + (char)(num / 10) * -10 | 0x30;
        lVar5 = lVar5 + -1;
        lVar3 = lVar3 + -1;
        num = num / 10;
      } while (lVar3 != 0);
      iVar2 = (int)lVar6;
    }
    return iVar2;
  }
  str[0] = '0';
  str[1] = '\0';
  return 1;
}

Assistant:

static int ulong_to_str(unsigned long num, char *str, int strlen)
{
   int len, i;
   unsigned long val;
   
   if (num == 0) {
      if (strlen < 2)
         return -1;
      str[0] = '0';
      str[1] = '\0';
      return 1;
   }

   for (len = 0, val = num; val; val = val / 10, len++);
   if (len + 1 >= strlen)
      return -1;

   str[len] = '\0';
   val = num;
   for (i = 1; i <= len; i++) {
      str[len - i] = '0' + val % 10;
      val = val / 10;
   }
   return len;
}